

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_buffer.cpp
# Opt level: O2

tuple<const_char_*,_long> __thiscall ReadBuffer::get_line(ReadBuffer *this)

{
  char *pcVar1;
  _Head_base<0UL,_const_char_*,_false> _Var2;
  _Tuple_impl<1UL,_long> in_RDI;
  long lVar3;
  tuple<const_char_*,_long> tVar4;
  tuple<const_char_*,_long> tVar5;
  
  pcVar1 = this->buffer;
  _Var2._M_head_impl = (char *)this->left;
  lVar3 = 0;
  while( true ) {
    if (this->right <= (long)(_Var2._M_head_impl + lVar3 + 1)) {
      *(long *)in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl = 0;
      *(long *)((long)in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl + 8) = 0;
      tVar4.super__Tuple_impl<0UL,_const_char_*,_long>.super__Head_base<0UL,_const_char_*,_false>.
      _M_head_impl = _Var2._M_head_impl;
      tVar4.super__Tuple_impl<0UL,_const_char_*,_long>.super__Tuple_impl<1UL,_long>.
      super__Head_base<1UL,_long,_false>._M_head_impl =
           in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl;
      return (tuple<const_char_*,_long>)tVar4.super__Tuple_impl<0UL,_const_char_*,_long>;
    }
    if ((_Var2._M_head_impl[(long)(pcVar1 + lVar3)] == '\r') &&
       (_Var2._M_head_impl[(long)(pcVar1 + lVar3 + 1)] == '\n')) break;
    lVar3 = lVar3 + 1;
  }
  tVar5.super__Tuple_impl<0UL,_const_char_*,_long>.super__Head_base<0UL,_const_char_*,_false>.
  _M_head_impl = _Var2._M_head_impl + lVar3 + 2;
  this->left = (ssize_t)tVar5.super__Tuple_impl<0UL,_const_char_*,_long>.
                        super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  *(long *)in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl = lVar3;
  *(char **)((long)in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl + 8) =
       _Var2._M_head_impl + (long)pcVar1;
  tVar5.super__Tuple_impl<0UL,_const_char_*,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl;
  return (tuple<const_char_*,_long>)tVar5.super__Tuple_impl<0UL,_const_char_*,_long>;
}

Assistant:

std::tuple<const char *, ssize_t> ReadBuffer::get_line() {
    ssize_t i;
    for (i = this->left; i + 1 < this->right; i++) {
        if (this->buffer[i] == '\r' && this->buffer[i + 1] == '\n') {
            auto result = std::make_tuple(this->buffer + this->left, i - this->left);
            this->left = i + 2;
            return result;
        }
    }
    return std::make_tuple(nullptr, 0);
}